

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O3

bool __thiscall BenevolentBotStrategy::canFortify(BenevolentBotStrategy *this)

{
  int iVar1;
  int iVar2;
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar3;
  Country *pCVar4;
  pointer ppCVar5;
  bool bVar6;
  Country *pCVar7;
  Country *pCVar8;
  pointer ppCVar9;
  pointer ppCVar10;
  
  pvVar3 = ((this->super_PlayerStrategy).player)->pOwnedCountries;
  ppCVar9 = (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar6 = false;
  pCVar7 = (Country *)0x0;
  do {
    pCVar4 = *ppCVar9;
    pCVar8 = pCVar4;
    if ((pCVar7 != (Country *)0x0) &&
       (iVar1 = *pCVar4->pNumberOfTroops, pCVar8 = pCVar7, iVar1 < *pCVar7->pNumberOfTroops)) {
      ppCVar10 = (pCVar4->pAdjCountries->
                 super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar5 = (pCVar4->pAdjCountries->
                super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppCVar10 != ppCVar5) {
        do {
          if (*(*ppCVar10)->pPlayerOwnerId == *pCVar4->pPlayerOwnerId) {
            iVar2 = *(*ppCVar10)->pNumberOfTroops;
            if (iVar1 < iVar2) {
              pCVar7 = pCVar4;
            }
            bVar6 = (bool)(bVar6 | iVar1 < iVar2);
          }
          ppCVar10 = ppCVar10 + 1;
          pCVar8 = pCVar7;
        } while (ppCVar10 != ppCVar5);
      }
    }
    ppCVar9 = ppCVar9 + 1;
    pCVar7 = pCVar8;
  } while (ppCVar9 !=
           (pvVar3->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
           super__Vector_impl_data._M_finish);
  ppCVar9 = (pCVar8->pAdjCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar10 = (pCVar8->pAdjCountries->
             super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppCVar9 != ppCVar10) {
    do {
      if (*(*ppCVar9)->pPlayerOwnerId == *pCVar8->pPlayerOwnerId) {
        bVar6 = (bool)(bVar6 | *pCVar8->pNumberOfTroops < *(*ppCVar9)->pNumberOfTroops);
      }
      ppCVar9 = ppCVar9 + 1;
    } while (ppCVar9 != ppCVar10);
  }
  return bVar6;
}

Assistant:

bool BenevolentBotStrategy::canFortify() {
    bool canFortify = false;
    Map::Country* smallestCountry = nullptr;

    for (auto* country: *player->getOwnedCountries()) {
        if (smallestCountry == nullptr) {
            smallestCountry = country;
        } else if (smallestCountry->getNumberOfTroops() > country->getNumberOfTroops()) {
            for (auto* neighbour : *country->getAdjCountries()) {
                if (neighbour->getPlayerOwnerID() == country->getPlayerOwnerID()
                    && neighbour->getNumberOfTroops() > country->getNumberOfTroops()) {
                    smallestCountry = country;
                    canFortify = true;
                }
            }
        }
    }

    for (auto* neighbour : *smallestCountry->getAdjCountries()) {
        if (neighbour->getPlayerOwnerID() == smallestCountry->getPlayerOwnerID()
                && neighbour->getNumberOfTroops() > smallestCountry->getNumberOfTroops()) {
            canFortify = true;
        }
    }
    return canFortify;
}